

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O2

void ArrayDelete<aiAnimation>(aiAnimation ***in,uint *num)

{
  aiAnimation **ppaVar1;
  aiAnimation *this;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; ppaVar1 = *in, uVar2 < *num; uVar2 = uVar2 + 1) {
    this = ppaVar1[uVar2];
    if (this != (aiAnimation *)0x0) {
      aiAnimation::~aiAnimation(this);
    }
    operator_delete(this);
  }
  if (ppaVar1 != (aiAnimation **)0x0) {
    operator_delete__(ppaVar1);
  }
  *in = (aiAnimation **)0x0;
  *num = 0;
  return;
}

Assistant:

inline void ArrayDelete(T**& in, unsigned int& num)
{
    for (unsigned int i = 0; i < num; ++i)
        delete in[i];

    delete[] in;
    in = NULL;
    num = 0;
}